

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

Bool CheckMetaData(TidyDocImpl *doc,Node *node,Bool HasMetaData)

{
  char cVar1;
  Dict *pDVar2;
  Dict *pDVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Bool BVar7;
  int iVar8;
  ctmbstr ptVar9;
  AttVal *pAVar10;
  ctmbstr cp;
  char *pcVar11;
  Node *node_00;
  ctmbstr cp_3;
  bool bVar12;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) {
    return HasMetaData;
  }
  if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_META)) {
    pAVar10 = node->attributes;
    bVar12 = false;
    if (pAVar10 != (AttVal *)0x0) {
      bVar5 = false;
      bVar4 = false;
      bVar6 = bVar12;
      do {
        if (((pAVar10->dict != (Attribute *)0x0) && (pAVar10->dict->id == TidyAttr_HTTP_EQUIV)) &&
           (pcVar11 = pAVar10->value, pcVar11 != (char *)0x0)) {
          do {
            if (*pcVar11 == '\0') goto LAB_00151a28;
            BVar7 = prvTidyIsWhite((int)*pcVar11);
            pcVar11 = pcVar11 + 1;
          } while (BVar7 != no);
          bVar6 = true;
          if ((pAVar10->value != (ctmbstr)0x0) &&
             (iVar8 = prvTidytmbstrcasecmp(pAVar10->value,"refresh"), iVar8 == 0)) {
            prvTidyReportAccessError(doc,node,0x2e6);
            bVar5 = true;
            bVar6 = true;
          }
        }
LAB_00151a28:
        if (((pAVar10->dict != (Attribute *)0x0) && (pAVar10->dict->id == TidyAttr_CONTENT)) &&
           (pcVar11 = pAVar10->value, pcVar11 != (char *)0x0)) {
          do {
            if (*pcVar11 == '\0') goto LAB_00151a91;
            BVar7 = prvTidyIsWhite((int)*pcVar11);
            pcVar11 = pcVar11 + 1;
          } while (BVar7 != no);
          iVar8 = prvTidytmbstrncmp(pAVar10->value,"http:",5);
          bVar6 = true;
          if (iVar8 == 0) {
            prvTidyReportAccessError(doc,node,0x2e7);
            bVar4 = true;
            bVar6 = true;
          }
        }
LAB_00151a91:
        BVar7 = prvTidyIsHTML5Mode(doc);
        if ((((BVar7 != no) && (pAVar10->dict != (Attribute *)0x0)) &&
            (pAVar10->dict->id == TidyAttr_CHARSET)) &&
           (pcVar11 = pAVar10->value, pcVar11 != (char *)0x0)) {
          do {
            if (*pcVar11 == '\0') goto LAB_00151acf;
            BVar7 = prvTidyIsWhite((int)*pcVar11);
            pcVar11 = pcVar11 + 1;
          } while (BVar7 != no);
          bVar6 = true;
        }
LAB_00151acf:
        pAVar10 = pAVar10->next;
      } while (pAVar10 != (AttVal *)0x0);
      bVar12 = bVar4 || bVar5;
      if (bVar6) {
        HasMetaData = yes;
      }
    }
    if (bVar12) {
      prvTidyReportAccessError(doc,node,0x30a);
      HasMetaData = yes;
    }
  }
  BVar7 = yes;
  if (HasMetaData != no) goto LAB_00151b89;
  pDVar2 = node->tag;
  if (pDVar2 == (Dict *)0x0) {
LAB_00151b48:
    BVar7 = prvTidynodeIsText(node->content);
    if (BVar7 != no) {
      ptVar9 = textFromOneNode(doc,node->content);
      do {
        cVar1 = *ptVar9;
        if (cVar1 == '\0') break;
        BVar7 = prvTidyIsWhite((int)cVar1);
        ptVar9 = ptVar9 + 1;
      } while (BVar7 != no);
      BVar7 = (Bool)(cVar1 != '\0');
      goto LAB_00151b89;
    }
  }
  else {
    if (((pDVar2->id == TidyTag_ADDRESS) && (node->content != (Node *)0x0)) &&
       ((pDVar3 = node->content->tag, pDVar3 != (Dict *)0x0 && (pDVar3->id == TidyTag_A))))
    goto LAB_00151b89;
    if ((pDVar2 == (Dict *)0x0) || (pDVar2->id != TidyTag_TITLE)) goto LAB_00151b48;
  }
  BVar7 = no;
LAB_00151b89:
  if (BVar7 == no) {
    BVar7 = no;
    if (((node->tag != (Dict *)0x0) && (BVar7 = no, node->tag->id == TidyTag_LINK)) &&
       ((pAVar10 = prvTidyAttrGetById(node,TidyAttr_REL), pAVar10 == (AttVal *)0x0 ||
        ((pAVar10->value == (ctmbstr)0x0 ||
         (ptVar9 = prvTidytmbsubstr(pAVar10->value,"stylesheet"), ptVar9 == (ctmbstr)0x0)))))) {
      BVar7 = yes;
    }
  }
  for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
    BVar7 = CheckMetaData(doc,node_00,BVar7);
  }
  return BVar7;
}

Assistant:

static Bool CheckMetaData( TidyDocImpl* doc, Node* node, Bool HasMetaData )
{
    Bool HasHttpEquiv = no;
    Bool HasContent = no;
    Bool ContainsAttr = no;

    if (Level2_Enabled( doc ))
    {
        if ( nodeIsMETA(node) )
        {
            AttVal* av;
            for (av = node->attributes; av != NULL; av = av->next)
            {
                if ( attrIsHTTP_EQUIV(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* Must not have an auto-refresh */
                    if (AttrValueIs(av, "refresh"))
                    {
                        HasHttpEquiv = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REFRESH );
                    }
                }

                if ( attrIsCONTENT(av) && hasValue(av) )
                {
                    ContainsAttr = yes;

                    /* If the value is not an integer, then it must not be a URL */
                    if ( TY_(tmbstrncmp)(av->value, "http:", 5) == 0)
                    {
                        HasContent = yes;
                        TY_(ReportAccessError)( doc, node, REMOVE_AUTO_REDIRECT);
                    }
                }
                if (TY_(IsHTML5Mode)(doc) && attrIsCHARSET(av) && hasValue(av))
                {
                    ContainsAttr = yes;
                }
            }
        
            if ( HasContent || HasHttpEquiv )
            {
                HasMetaData = yes;
                TY_(ReportAccessError)( doc, node, METADATA_MISSING_REDIRECT_AUTOREFRESH);
            }
            else
            {
                if ( ContainsAttr && !HasContent && !HasHttpEquiv )
                    HasMetaData = yes;                    
            }
        }

        if ( !HasMetaData && 
             nodeIsADDRESS(node) &&
             nodeIsA(node->content) )
        {
            HasMetaData = yes;
        }
            
        if ( !HasMetaData &&
             !nodeIsTITLE(node) &&
             TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
                HasMetaData = yes;
        }

        if( !HasMetaData && nodeIsLINK(node) )
        {
            AttVal* av = attrGetREL(node);
            if( !AttrContains(av, "stylesheet") )
                HasMetaData = yes;
        }
            
        /* Check for MetaData */
        for ( node = node->content; node; node = node->next )
        {
            HasMetaData = CheckMetaData( doc, node, HasMetaData );
        }
    }
    return HasMetaData;
}